

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

int armoroff(obj *otmp)

{
  int nval;
  int iVar1;
  int delay;
  obj *otmp_local;
  
  nval = -(int)objects[otmp->otyp].oc_delay;
  iVar1 = cursed(otmp);
  if (iVar1 == 0) {
    if (nval == 0) {
      if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x05')) {
        Cloak_off();
      }
      else if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x01')) {
        Shield_off();
      }
      else if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x06')) {
        Shirt_off();
      }
      else {
        setworn((obj *)0x0,(ulong)(otmp->owornmask & 0x7f));
      }
      off_msg(otmp,'\x01');
    }
    else {
      nomul(nval,"disrobing");
      nomovemsg = off_msg_str(otmp,nval < -1,'\x01');
      if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x02')) {
        afternmv = Helmet_off;
      }
      else if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x03')) {
        afternmv = Gloves_off;
      }
      else if ((otmp->oclass == '\x03') && (objects[otmp->otyp].oc_subtyp == '\x04')) {
        afternmv = Boots_off;
      }
      else {
        afternmv = Armor_off;
      }
    }
    taking_off = 0;
    takeoff_mask = 0;
    otmp_local._4_4_ = 1;
  }
  else {
    otmp_local._4_4_ = 0;
  }
  return otmp_local._4_4_;
}

Assistant:

int armoroff(struct obj *otmp)
{
	int delay = -objects[otmp->otyp].oc_delay;

	if (cursed(otmp)) return 0;
	if (delay) {
		nomul(delay, "disrobing");
		nomovemsg = off_msg_str(otmp, -delay > 1, TRUE);
		if (is_helmet(otmp))
			afternmv = Helmet_off;
		else if (is_gloves(otmp))
			afternmv = Gloves_off;
		else if (is_boots(otmp))
			afternmv = Boots_off;
		else
			afternmv = Armor_off;
	} else {
		if (is_cloak(otmp))
			Cloak_off();
		else if (is_shield(otmp))
			Shield_off();
		else if (is_shirt(otmp))
			Shirt_off();
		else setworn(NULL, otmp->owornmask & W_ARMOR);
		off_msg(otmp, TRUE);
	}
	takeoff_mask = taking_off = 0L;
	return 1;
}